

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_helper.c
# Opt level: O0

void helper_v7m_vlstm_aarch64(CPUARMState_conflict *env,uint32_t fptr)

{
  uint uVar1;
  _Bool _Var2;
  int iVar3;
  uint32_t val;
  uint64_t *puVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  bool bVar7;
  uintptr_t unaff_retaddr;
  uint32_t shi;
  uint32_t slo;
  uint32_t faddr;
  uint64_t dn;
  int i;
  _Bool ts;
  uintptr_t ra;
  _Bool lspact;
  _Bool s;
  uint32_t fptr_local;
  CPUARMState_conflict *env_local;
  
  uVar1 = (env->v7m).fpccr[((env->v7m).fpccr[1] & 4) != 0];
  if ((env->v7m).secure == 0) {
    __assert_fail("env->v7m.secure",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/m_helper.c"
                  ,0x3c4,"void helper_v7m_vlstm_aarch64(CPUARMState *, uint32_t)");
  }
  if (((env->v7m).control[1] & 8) != 0) {
    iVar3 = arm_current_el(env);
    _Var2 = v7m_cpacr_pass(env,true,iVar3 != 0);
    if (!_Var2) {
      raise_exception_ra_aarch64(env,0x11,0,1,unaff_retaddr);
    }
    if ((uVar1 & 1) != 0) {
      raise_exception_ra_aarch64(env,0x15,0,1,unaff_retaddr);
    }
    if ((fptr & 7) != 0) {
      raise_exception_ra_aarch64(env,0x16,0,1,unaff_retaddr);
    }
    if (((env->v7m).fpccr[1] & 0x40000000) == 0) {
      bVar7 = ((env->v7m).fpccr[1] & 0x4000000) != 0;
      dn._0_4_ = 0;
      while( true ) {
        iVar3 = 0x10;
        if (bVar7) {
          iVar3 = 0x20;
        }
        if (iVar3 <= (int)dn) break;
        puVar4 = aa32_vfp_dreg(env,(int)dn / 2);
        uVar6 = *puVar4;
        shi = fptr + (int)dn * 4;
        uVar5 = extract64(uVar6,0,0x20);
        uVar6 = extract64(uVar6,0x20,0x20);
        if (0xf < (int)dn) {
          shi = shi + 8;
        }
        cpu_stl_data_ra_aarch64(env,(ulong)shi,(uint32_t)uVar5,unaff_retaddr);
        cpu_stl_data_ra_aarch64(env,(ulong)(shi + 4),(uint32_t)uVar6,unaff_retaddr);
        dn._0_4_ = (int)dn + 2;
      }
      val = vfp_get_fpscr_aarch64(env);
      cpu_stl_data_ra_aarch64(env,(ulong)(fptr + 0x40),val,unaff_retaddr);
      if (bVar7) {
        for (dn._0_4_ = 0; (int)dn < 0x20; dn._0_4_ = (int)dn + 2) {
          puVar4 = aa32_vfp_dreg(env,(int)dn / 2);
          *puVar4 = 0;
        }
        vfp_set_fpscr_aarch64(env,0);
      }
    }
    else {
      v7m_update_fpccr(env,fptr,false);
    }
    (env->v7m).control[1] = (env->v7m).control[1] & 0xfffffffb;
  }
  return;
}

Assistant:

void HELPER(v7m_vlstm)(CPUARMState *env, uint32_t fptr)
{
    /* fptr is the value of Rn, the frame pointer we store the FP regs to */
    bool s = env->v7m.fpccr[M_REG_S] & R_V7M_FPCCR_S_MASK;
    bool lspact = env->v7m.fpccr[s] & R_V7M_FPCCR_LSPACT_MASK;
    uintptr_t ra = GETPC();

    assert(env->v7m.secure);

    if (!(env->v7m.control[M_REG_S] & R_V7M_CONTROL_SFPA_MASK)) {
        return;
    }

    /* Check access to the coprocessor is permitted */
    if (!v7m_cpacr_pass(env, true, arm_current_el(env) != 0)) {
        raise_exception_ra(env, EXCP_NOCP, 0, 1, GETPC());
    }

    if (lspact) {
        /* LSPACT should not be active when there is active FP state */
        raise_exception_ra(env, EXCP_LSERR, 0, 1, GETPC());
    }

    if (fptr & 7) {
        raise_exception_ra(env, EXCP_UNALIGNED, 0, 1, GETPC());
    }

    /*
     * Note that we do not use v7m_stack_write() here, because the
     * accesses should not set the FSR bits for stacking errors if they
     * fail. (In pseudocode terms, they are AccType_NORMAL, not AccType_STACK
     * or AccType_LAZYFP). Faults in cpu_stl_data_ra() will throw exceptions
     * and longjmp out.
     */
    if (!(env->v7m.fpccr[M_REG_S] & R_V7M_FPCCR_LSPEN_MASK)) {
        bool ts = env->v7m.fpccr[M_REG_S] & R_V7M_FPCCR_TS_MASK;
        int i;

        for (i = 0; i < (ts ? 32 : 16); i += 2) {
            uint64_t dn = *aa32_vfp_dreg(env, i / 2);
            uint32_t faddr = fptr + 4 * i;
            uint32_t slo = extract64(dn, 0, 32);
            uint32_t shi = extract64(dn, 32, 32);

            if (i >= 16) {
                faddr += 8; /* skip the slot for the FPSCR */
            }
            cpu_stl_data_ra(env, faddr, slo, ra);
            cpu_stl_data_ra(env, faddr + 4, shi, ra);
        }
        cpu_stl_data_ra(env, fptr + 0x40, vfp_get_fpscr(env), ra);

        /*
         * If TS is 0 then s0 to s15 and FPSCR are UNKNOWN; we choose to
         * leave them unchanged, matching our choice in v7m_preserve_fp_state.
         */
        if (ts) {
            for (i = 0; i < 32; i += 2) {
                *aa32_vfp_dreg(env, i / 2) = 0;
            }
            vfp_set_fpscr(env, 0);
        }
    } else {
        v7m_update_fpccr(env, fptr, false);
    }

    env->v7m.control[M_REG_S] &= ~R_V7M_CONTROL_FPCA_MASK;
}